

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Unmarshall.c
# Opt level: O2

WJTL_STATUS TestUnmarshallSubDictionaries(void)

{
  size_t sVar1;
  JL_STATUS JVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  JL_STATUS JVar6;
  JL_STATUS JVar7;
  JL_STATUS JVar8;
  WJTL_STATUS WVar9;
  bool Condition;
  bool Condition_00;
  bool Condition_01;
  bool Condition_02;
  size_t errorAtPos;
  OuterStruct theStruct;
  JlMarshallElement local_2d8;
  JL_DATA_TYPE local_278;
  char *local_270;
  undefined1 local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined6 uStack_238;
  undefined2 uStack_232;
  undefined6 uStack_230;
  undefined8 *local_228;
  undefined4 local_220;
  JlMarshallElement marshalInnerStruct1 [2];
  undefined8 local_158;
  char *pcStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  uint32_t local_f8;
  char *local_f0;
  undefined1 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined4 local_b0;
  undefined2 local_ac;
  undefined8 local_a8;
  undefined4 local_a0;
  JL_DATA_TYPE local_98;
  char *local_90;
  undefined1 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined6 uStack_58;
  undefined2 uStack_52;
  undefined6 uStack_50;
  JlMarshallElement *local_48;
  uint32_t local_40;
  
  errorAtPos = 0;
  memcpy(marshalInnerStruct1,&DAT_00141530,0xc0);
  local_228 = &local_158;
  local_108 = 0;
  uStack_100 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 1;
  pcStack_150 = "str2";
  local_2d8.ChildStructDescriptionCount = 2;
  local_f0 = "num2";
  WVar9 = WJTL_STATUS_SUCCESS;
  local_e8 = 0;
  local_e0 = 8;
  local_d8 = 4;
  local_d0 = 0;
  uStack_c8 = 0;
  local_c0 = 0;
  uStack_b8 = 0;
  local_b0 = 10;
  local_ac = 0;
  local_a8 = 0;
  local_a0 = 0;
  local_2d8.Type = JL_DATA_TYPE_DICTIONARY;
  local_90 = "inner";
  local_88 = 0;
  local_80 = 0x10;
  local_78 = 0x10;
  local_60 = 0;
  uStack_58 = 0;
  uStack_52 = 0;
  uStack_50 = 0;
  local_2d8.Name = "inner1";
  local_2d8.IsArray = false;
  local_2d8.FieldOffset = 0;
  local_70 = 0;
  uStack_68 = 0;
  local_2d8.FieldSize = 0x10;
  local_2d8.CountFieldOffset = 0;
  local_2d8.CountFieldSize = 0;
  local_2d8.ArrayFieldSize = 0;
  local_2d8.ArrayItemSize._0_6_ = 0;
  local_2d8.ArrayItemSize._6_2_ = 0;
  local_2d8.NumberType = JL_NUM_TYPE_NONE;
  local_2d8.IsHex = false;
  local_2d8.IsBase64 = false;
  local_270 = "inner2";
  local_268 = 0;
  local_260 = 0x10;
  local_258 = 0x20;
  local_240 = 0;
  uStack_238 = 0;
  uStack_232 = 0;
  uStack_230 = 0;
  local_250 = 0;
  uStack_248 = 0;
  local_220 = 3;
  theStruct.Inner2.Inner.String1 = (char *)0x0;
  theStruct.Inner2.Inner.Number1 = 0;
  theStruct.Inner2.Inner._12_4_ = 0;
  theStruct.Inner2.String2 = (char *)0x0;
  theStruct.Inner2.Number2 = 0;
  theStruct.Inner2._12_4_ = 0;
  theStruct.Inner1.String1 = (char *)0x0;
  theStruct.Inner1.Number1 = 0;
  theStruct.Inner1._12_4_ = 0;
  local_2d8.ChildStructDescription = marshalInnerStruct1;
  local_278 = local_2d8.Type;
  local_f8 = local_2d8.ChildStructDescriptionCount;
  local_98 = local_2d8.Type;
  local_48 = marshalInnerStruct1;
  local_40 = local_2d8.ChildStructDescriptionCount;
  JVar2 = JlJsonToStruct("{ \"inner1\": { \"str1\":\"String1\", \"num1\":100 }, \"inner2\": { \"str2\":\"String2\", \"num2\":200, \"inner\":{\"str1\":\"String111\",\"num1\":111} } } }"
                         ,&local_2d8,2,&theStruct,&errorAtPos);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{ \\\"inner1\\\": { \\\"str1\\\":\\\"String1\\\", \\\"num1\\\":100 }, \\\"inner2\\\": { \\\"str2\\\":\\\"String2\\\", \\\"num2\\\":200, \\\"inner\\\":{\\\"str1\\\":\\\"String111\\\",\\\"num1\\\":111} } } }\", marshalOuterStruct, ( sizeof(marshalOuterStruct) / sizeof((marshalOuterStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x41c);
  Condition = errorAtPos == 0;
  WjTestLib_Assert(Condition,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x41d);
  iVar3 = strcmp(theStruct.Inner1.String1,"String1");
  WjTestLib_Assert(iVar3 == 0,"strcmp( theStruct.Inner1.String1, \"String1\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x41e);
  Condition_00 = theStruct.Inner1.Number1 == 100;
  WjTestLib_Assert(Condition_00,"100 == theStruct.Inner1.Number1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x41f);
  iVar4 = strcmp(theStruct.Inner2.String2,"String2");
  WjTestLib_Assert(iVar4 == 0,"strcmp( theStruct.Inner2.String2, \"String2\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x420);
  Condition_01 = theStruct.Inner2.Number2 == 200;
  WjTestLib_Assert(Condition_01,"200 == theStruct.Inner2.Number2",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x421);
  iVar5 = strcmp(theStruct.Inner2.Inner.String1,"String111");
  WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.Inner2.Inner.String1, \"String111\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x422);
  Condition_02 = theStruct.Inner2.Inner.Number1 == 0x6f;
  WjTestLib_Assert(Condition_02,"111 == theStruct.Inner2.Inner.Number1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x423);
  JVar6 = JlUnmarshallFreeStructAllocs(&local_2d8,2,&theStruct);
  WjTestLib_Assert(JVar6 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlUnmarshallFreeStructAllocs( marshalOuterStruct, ( sizeof(marshalOuterStruct) / sizeof((marshalOuterStruct)[0]) ), &theStruct ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x425);
  JVar7 = JlJsonToStruct("{ \"inner1\": { \"str1\": \"String1\", \"num1\":100 }, \"inner2\": { \"str2\":true, \"num2\":200, \"inner\":{\"str1\":\"String111\",\"num1\":111} } } }"
                         ,&local_2d8,2,&theStruct,&errorAtPos);
  WjTestLib_Assert(JVar7 == JL_STATUS_WRONG_TYPE,
                   "(JlJsonToStruct( \"{ \\\"inner1\\\": { \\\"str1\\\": \\\"String1\\\", \\\"num1\\\":100 }, \\\"inner2\\\": { \\\"str2\\\":true, \\\"num2\\\":200, \\\"inner\\\":{\\\"str1\\\":\\\"String111\\\",\\\"num1\\\":111} } } }\", marshalOuterStruct, ( sizeof(marshalOuterStruct) / sizeof((marshalOuterStruct)[0]) ), &theStruct, &errorAtPos )) == (JL_STATUS_WRONG_TYPE)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x42a);
  sVar1 = errorAtPos;
  WjTestLib_Assert(errorAtPos == 0x42,"66 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x42b);
  JVar8 = JlJsonToStruct("{ \"inner1\": { \"str1\": \"String1\", \"num1\":100 }, \"inner2\": 100 } }"
                         ,&local_2d8,2,&theStruct,&errorAtPos);
  WjTestLib_Assert(JVar8 == JL_STATUS_WRONG_TYPE,
                   "(JlJsonToStruct( \"{ \\\"inner1\\\": { \\\"str1\\\": \\\"String1\\\", \\\"num1\\\":100 }, \\\"inner2\\\": 100 } }\", marshalOuterStruct, ( sizeof(marshalOuterStruct) / sizeof((marshalOuterStruct)[0]) ), &theStruct, &errorAtPos )) == (JL_STATUS_WRONG_TYPE)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x430);
  if ((!Condition_02 || (iVar5 != 0 || !Condition_01)) ||
      ((iVar4 != 0 || !Condition_00) || (!Condition || (iVar3 != 0 || JVar2 != JL_STATUS_SUCCESS))))
  {
    WVar9 = WJTL_STATUS_FAILED;
  }
  if (errorAtPos != 0x39) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  if (JVar8 != JL_STATUS_WRONG_TYPE) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  if (sVar1 != 0x42) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  if (JVar7 != JL_STATUS_WRONG_TYPE) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  if (JVar6 != JL_STATUS_SUCCESS) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(errorAtPos == 0x39,"57 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallSubDictionaries",0x431);
  return WVar9;
}

Assistant:

static
WJTL_STATUS
    TestUnmarshallSubDictionaries
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;
    size_t errorAtPos = 0;

    typedef struct
    {
        char*       String1;
        uint32_t    Number1;
    } InnerStruct1;

    typedef struct
    {
        char*           String2;
        uint32_t        Number2;
        InnerStruct1    Inner;
    } InnerStruct2;

    typedef struct
    {
        InnerStruct1    Inner1;
        InnerStruct2    Inner2;
    } OuterStruct;

    JlMarshallElement marshalInnerStruct1[] = {
        JlMarshallString( InnerStruct1, String1, "str1" ),
        JlMarshallUnsigned( InnerStruct1, Number1, "num1" ),
    };

    JlMarshallElement marshalInnerStruct2[] = {
        JlMarshallString( InnerStruct2, String2, "str2" ),
        JlMarshallUnsigned( InnerStruct2, Number2, "num2" ),
        JlMarshallStruct( InnerStruct2, Inner, "inner", marshalInnerStruct1, NumElements(marshalInnerStruct1) ),
    };
    JlMarshallElement marshalOuterStruct[] = {
        JlMarshallStruct( OuterStruct, Inner1, "inner1", marshalInnerStruct1, NumElements(marshalInnerStruct1) ),
        JlMarshallStruct( OuterStruct, Inner2, "inner2", marshalInnerStruct2, NumElements(marshalInnerStruct2) ),
    };

    OuterStruct theStruct = {{0}};

    // Verify working
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{ \"inner1\": { \"str1\":\"String1\", \"num1\":100 }, \"inner2\": { \"str2\":\"String2\", \"num2\":200, \"inner\":{\"str1\":\"String111\",\"num1\":111} } } }",
         marshalOuterStruct, NumElements(marshalOuterStruct), &theStruct, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );
    JL_ASSERT( strcmp( theStruct.Inner1.String1, "String1" ) == 0 );
    JL_ASSERT( 100 == theStruct.Inner1.Number1 );
    JL_ASSERT( strcmp( theStruct.Inner2.String2, "String2" ) == 0 );
    JL_ASSERT( 200 == theStruct.Inner2.Number2 );
    JL_ASSERT( strcmp( theStruct.Inner2.Inner.String1, "String111" ) == 0 );
    JL_ASSERT( 111 == theStruct.Inner2.Inner.Number1 );

    JL_ASSERT_SUCCESS( JlUnmarshallFreeStructAllocs( marshalOuterStruct, NumElements(marshalOuterStruct), &theStruct ) );

    // Verify wrong type in a sub dictionary
    JL_ASSERT_STATUS( JlJsonToStruct(
        "{ \"inner1\": { \"str1\": \"String1\", \"num1\":100 }, \"inner2\": { \"str2\":true, \"num2\":200, \"inner\":{\"str1\":\"String111\",\"num1\":111} } } }",
         marshalOuterStruct, NumElements(marshalOuterStruct), &theStruct, &errorAtPos ), JL_STATUS_WRONG_TYPE );
    JL_ASSERT( 66 == errorAtPos );

    // Verify wrong type in base
    JL_ASSERT_STATUS( JlJsonToStruct(
        "{ \"inner1\": { \"str1\": \"String1\", \"num1\":100 }, \"inner2\": 100 } }",
         marshalOuterStruct, NumElements(marshalOuterStruct), &theStruct, &errorAtPos ), JL_STATUS_WRONG_TYPE );
    JL_ASSERT( 57 == errorAtPos );

    return TestReturn;
}